

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O1

bool __thiscall google::protobuf::FieldDescriptor::is_packed(FieldDescriptor *this)

{
  long lVar1;
  undefined1 uVar2;
  FieldDescriptor *local_18;
  _func_void_FieldDescriptor_ptr *local_10;
  
  if (*(int *)(this + 0x3c) != 3) {
    return false;
  }
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_10 = TypeOnceInit;
    local_18 = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),&local_10,&local_18);
  }
  if (*(int *)(this + 0x38) - 0xdU < 0xfffffffc) {
    lVar1 = *(long *)(this + 0x78);
    if (*(int *)(*(long *)(this + 0x28) + 0x3c) == 2) {
      if (lVar1 == 0) goto LAB_003200b9;
    }
    else {
      if (lVar1 == 0) {
        return true;
      }
      if ((*(byte *)(lVar1 + 0x28) & 2) == 0) {
        return true;
      }
    }
    uVar2 = *(undefined1 *)(lVar1 + 0x4c);
  }
  else {
LAB_003200b9:
    uVar2 = 0;
  }
  return (bool)uVar2;
}

Assistant:

inline bool FieldDescriptor::is_repeated() const {
  return label() == LABEL_REPEATED;
}